

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePart::StructOperator::Operation<duckdb::timestamp_t>
               (bigint_vec *bigint_values,double_vec *double_values,timestamp_t *input,idx_t idx,
               part_mask_t mask)

{
  double *pdVar1;
  double dVar2;
  dtime_t t;
  date_t d;
  _Vector_base<double_*,_std::allocator<double_*>_> local_60;
  _Vector_base<double_*,_std::allocator<double_*>_> local_48;
  
  duckdb::Timestamp::Convert((timestamp_t)input->value,&d,&t);
  Operation<duckdb::date_t>(bigint_values,double_values,&d,idx,mask & 0xfffffffffffffff7);
  Operation<duckdb::dtime_t>(bigint_values,double_values,&t,idx,mask & 0xfffffffffffffff7);
  if ((mask & 8) != 0) {
    std::vector<double_*,_std::allocator<double_*>_>::vector
              ((vector<double_*,_std::allocator<double_*>_> *)&local_48,
               &double_values->super_vector<double_*,_std::allocator<double_*>_>);
    pdVar1 = HasPartValue<double*>((vector<double_*,_true> *)&local_48,BEGIN_DOUBLE);
    std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base(&local_48);
    if (pdVar1 != (double *)0x0) {
      dVar2 = EpochOperator::Operation<duckdb::timestamp_t,double>((timestamp_t)input->value);
      pdVar1[idx] = dVar2;
    }
  }
  if ((char)mask < '\0') {
    std::vector<double_*,_std::allocator<double_*>_>::vector
              ((vector<double_*,_std::allocator<double_*>_> *)&local_60,
               &double_values->super_vector<double_*,_std::allocator<double_*>_>);
    pdVar1 = HasPartValue<double*>((vector<double_*,_true> *)&local_60,JULIAN_DAY);
    std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base(&local_60);
    if (pdVar1 != (double *)0x0) {
      dVar2 = (double)duckdb::Timestamp::GetJulianDay((timestamp_t)input->value);
      pdVar1[idx] = dVar2;
    }
  }
  return;
}

Assistant:

void DatePart::StructOperator::Operation(bigint_vec &bigint_values, double_vec &double_values, const timestamp_t &input,
                                         const idx_t idx, const part_mask_t mask) {
	D_ASSERT(Timestamp::IsFinite(input));
	date_t d;
	dtime_t t;
	Timestamp::Convert(input, d, t);

	// Both define epoch, and the correct value is the sum.
	// So mask it out and compute it separately.
	Operation(bigint_values, double_values, d, idx, mask & ~UnsafeNumericCast<part_mask_t>(EPOCH));
	Operation(bigint_values, double_values, t, idx, mask & ~UnsafeNumericCast<part_mask_t>(EPOCH));

	if (mask & EPOCH) {
		auto part_data = HasPartValue(double_values, DatePartSpecifier::EPOCH);
		if (part_data) {
			part_data[idx] = EpochOperator::Operation<timestamp_t, double>(input);
		}
	}

	if (mask & JD) {
		auto part_data = HasPartValue(double_values, DatePartSpecifier::JULIAN_DAY);
		if (part_data) {
			part_data[idx] = JulianDayOperator::Operation<timestamp_t, double>(input);
		}
	}
}